

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O0

Cut_Cut_t * Cut_CutDupList(Cut_Man_t *p,Cut_Cut_t *pList)

{
  char *__dest;
  Cut_Cut_t *pCopy;
  Cut_Cut_t *pTemp;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pHead;
  Cut_Cut_t *pList_local;
  Cut_Man_t *p_local;
  
  ppTail = (Cut_Cut_t **)0x0;
  pTemp = (Cut_Cut_t *)&ppTail;
  pCopy = pList;
  pHead = pList;
  pList_local = (Cut_Cut_t *)p;
  if (pList == (Cut_Cut_t *)0x0) {
    p_local = (Cut_Man_t *)0x0;
  }
  else {
    for (; pCopy != (Cut_Cut_t *)0x0; pCopy = pCopy->pNext) {
      __dest = Extra_MmFixedEntryFetch(*(Extra_MmFixed_t **)(pList_local + 2));
      memcpy(__dest,pCopy,(long)(int)pList_local[2].uCanon0);
      *(char **)pTemp = __dest;
      pTemp = (Cut_Cut_t *)(__dest + 0x10);
    }
    *(undefined8 *)pTemp = 0;
    p_local = (Cut_Man_t *)ppTail;
  }
  return (Cut_Cut_t *)p_local;
}

Assistant:

Cut_Cut_t * Cut_CutDupList( Cut_Man_t * p, Cut_Cut_t * pList )
{
    Cut_Cut_t * pHead = NULL, ** ppTail = &pHead;
    Cut_Cut_t * pTemp, * pCopy;
    if ( pList == NULL )
        return NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        pCopy = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
        memcpy( pCopy, pTemp, p->EntrySize );
        *ppTail = pCopy;
        ppTail = &pCopy->pNext;
    }
    *ppTail = NULL;
    return pHead;
}